

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  undefined4 uVar1;
  Expr *pEVar2;
  int iVar3;
  ExprList *pEVar4;
  Expr *pEVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  Expr *local_48;
  Expr *local_40;
  
  if (p != (ExprList *)0x0) {
    iVar3 = sqlite3DbMallocSize(db,p);
    pEVar4 = (ExprList *)sqlite3DbMallocRawNN(db,(long)iVar3);
    iVar3 = 0;
    if (pEVar4 != (ExprList *)0x0) {
      uVar7._0_4_ = p->nExpr;
      uVar7._4_4_ = p->nAlloc;
      pEVar4->nExpr = (undefined4)uVar7;
      pEVar4->nAlloc = uVar7._4_4_;
      lVar8 = 8;
      local_48 = (Expr *)0x0;
      local_40 = (Expr *)0x0;
      for (; iVar3 < (int)uVar7; iVar3 = iVar3 + 1) {
        pEVar2 = *(Expr **)((long)p->a + lVar8 + -8);
        pEVar5 = sqlite3ExprDup(db,pEVar2,flags);
        *(Expr **)((long)pEVar4->a + lVar8 + -8) = pEVar5;
        if ((pEVar2 != (Expr *)0x0) && (pEVar5 != (Expr *)0x0 && pEVar2->op == 0xb2)) {
          if (pEVar5->pRight == (Expr *)0x0) {
            pEVar2 = pEVar2->pLeft;
            if (pEVar2 != local_48) {
              local_40 = sqlite3ExprDup(db,pEVar2,flags);
              pEVar5->pRight = local_40;
              local_48 = pEVar2;
            }
          }
          else {
            local_40 = pEVar5->pRight;
            local_48 = pEVar2->pRight;
          }
          pEVar5->pLeft = local_40;
        }
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].pExpr + lVar8));
        *(char **)((long)&pEVar4->a[0].pExpr + lVar8) = pcVar6;
        uVar1 = *(undefined4 *)((long)&p->a[0].zEName + lVar8);
        *(undefined4 *)((long)&pEVar4->a[0].zEName + lVar8) = uVar1;
        *(ushort *)((long)&pEVar4->a[0].zEName + lVar8 + 1) = (ushort)((uint)uVar1 >> 8) & 0xfffb;
        *(undefined4 *)((long)&pEVar4->a[0].zEName + lVar8 + 4) =
             *(undefined4 *)((long)&p->a[0].zEName + lVar8 + 4);
        uVar7 = (ulong)(uint)p->nExpr;
        lVar8 = lVar8 + 0x18;
      }
      return pEVar4;
    }
  }
  return (ExprList *)0x0;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, const ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem;
  const struct ExprList_item *pOldItem;
  int i;
  Expr *pPriorSelectColOld = 0;
  Expr *pPriorSelectColNew = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sqlite3DbMallocSize(db, p));
  if( pNew==0 ) return 0;
  pNew->nExpr = p->nExpr;
  pNew->nAlloc = p->nAlloc;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0
    ){
      if( pNewExpr->pRight ){
        pPriorSelectColOld = pOldExpr->pRight;
        pPriorSelectColNew = pNewExpr->pRight;
        pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        if( pOldExpr->pLeft!=pPriorSelectColOld ){
          pPriorSelectColOld = pOldExpr->pLeft;
          pPriorSelectColNew = sqlite3ExprDup(db, pPriorSelectColOld, flags);
          pNewExpr->pRight = pPriorSelectColNew;
        }
        pNewExpr->pLeft = pPriorSelectColNew;
      }
    }
    pItem->zEName = sqlite3DbStrDup(db, pOldItem->zEName);
    pItem->fg = pOldItem->fg;
    pItem->fg.done = 0;
    pItem->u = pOldItem->u;
  }
  return pNew;
}